

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

string * __thiscall
libcellml::Printer::PrinterImpl::printVariable
          (string *__return_storage_ptr__,PrinterImpl *this,VariablePtr *variable,IdList *idList,
          bool autoIds)

{
  long *plVar1;
  long *plVar2;
  size_type *psVar3;
  string interface_type;
  string initial_value;
  string units;
  string id;
  string name;
  long *local_130;
  long local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  NamedEntity::name_abi_cxx11_
            (&local_70,
             &((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_NamedEntity);
  Entity::id_abi_cxx11_
            (&local_90,
             (Entity *)
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr);
  if (local_d0._M_dataplus._M_p == (pointer)0x0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  }
  else {
    Variable::units((variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
    NamedEntity::name_abi_cxx11_(&local_b0,(NamedEntity *)local_f0._M_dataplus._M_p);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length);
  }
  Variable::initialValue_abi_cxx11_
            (&local_d0,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  Variable::interfaceType_abi_cxx11_
            (&local_f0,
             (variable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  if (local_70._M_string_length != 0) {
    std::operator+(&local_110," name=\"",&local_70);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_b0._M_string_length != 0) {
    std::operator+(&local_110," units=\"",&local_b0);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::operator+(&local_110," initial_value=\"",&local_d0);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::operator+(&local_110," interface=\"",&local_f0);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_90._M_string_length == 0) {
    if (!autoIds) goto LAB_0024c366;
    makeUniqueId(&local_50,idList);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2a7454);
    psVar3 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_110.field_2._M_allocated_capacity = *psVar3;
      local_110.field_2._8_8_ = plVar1[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar3;
      local_110._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_110._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0024c366;
  }
  else {
    std::operator+(&local_110," id=\"",&local_90);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_120 = *plVar2;
      lStack_118 = plVar1[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar2;
      local_130 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_130);
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    local_50.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == &local_110.field_2) goto LAB_0024c366;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_0024c366:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Printer::PrinterImpl::printVariable(const VariablePtr &variable, IdList &idList, bool autoIds)
{
    std::string repr;
    repr += "<variable";
    std::string name = variable->name();
    std::string id = variable->id();
    std::string units = variable->units() != nullptr ? variable->units()->name() : "";
    std::string initial_value = variable->initialValue();
    std::string interface_type = variable->interfaceType();
    if (!name.empty()) {
        repr += " name=\"" + name + "\"";
    }
    if (!units.empty()) {
        repr += " units=\"" + units + "\"";
    }
    if (!initial_value.empty()) {
        repr += " initial_value=\"" + initial_value + "\"";
    }
    if (!interface_type.empty()) {
        repr += " interface=\"" + interface_type + "\"";
    }
    if (!id.empty()) {
        repr += " id=\"" + id + "\"";
    } else if (autoIds) {
        repr += " id=\"" + makeUniqueId(idList) + "\"";
    }

    repr += "/>";
    return repr;
}